

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O3

void __thiscall
rpn::CommandCallExpression::CallCommand
          (CommandCallExpression *this,results_iterator argsBegin,results_iterator argsEnd,
          CommandContext *commandContext)

{
  anon_class_16_2_7294f495 __f;
  string result;
  string delimiter;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,", ","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"[call(","");
  std::operator+(&local_48,argsBegin._M_current,&local_68);
  std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  __f.delimiter = &local_68;
  __f.result = &local_88;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,rpn::CommandCallExpression::CallCommand(__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,rpn::CommandContext&)const::_lambda(auto:1_const&)_1_>
            (argsBegin._M_current + 1,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )argsEnd._M_current,__f);
  std::__cxx11::string::resize
            ((ulong)&local_88,(char)local_88._M_string_length - (char)local_68._M_string_length);
  std::__cxx11::string::append((char *)&local_88);
  std::__cxx11::string::operator=((string *)commandContext,(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CallCommand(
        results_iterator argsBegin,
        results_iterator argsEnd,
        CommandContext& commandContext) const
    {
        const auto& name = *argsBegin;
        std::advance(argsBegin, 1);

        const std::string delimiter{", "};
        std::string result{"[call("};
        result += name + delimiter;

        std::for_each(
            argsBegin, argsEnd, [&result, &delimiter](const auto& arg) {
                result += arg + delimiter;
            });
        result.resize(result.size() - delimiter.size());
        result += ")]";

        commandContext.result = std::move(result);
    }